

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstructMapExpression
          (duckdb *this,ClientContext *context,idx_t param_2,ColumnMapResult *mapping,
          MultiFileColumnDefinition *global_column,bool is_trivially_mappable)

{
  LogicalType *other;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  _func_int **pp_Var4;
  bool bVar5;
  MultiFileColumnDefinition *pMVar6;
  reference pvVar7;
  reference target_type;
  pointer *__ptr;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [40];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  LogicalType local_190;
  LogicalType local_178;
  idx_t local_idx_local;
  ScalarFunction remap_fun;
  
  local_1d0._24_8_ = context;
  local_idx_local = param_2;
  pMVar6 = optional_ptr<const_duckdb::MultiFileColumnDefinition,_true>::operator*
                     (&mapping->local_column);
  local_1d0._8_8_ = (pointer)0x0;
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
            ((duckdb *)&remap_fun,&pMVar6->type,&local_idx_local);
  local_1d0._8_8_ =
       remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  other = &global_column->type;
  if ((global_column->type).id_ == STRUCT) {
    if ((mapping->column_map).is_null == false) {
      if ((mapping->column_map).type_.id_ != STRUCT || is_trivially_mappable) goto LAB_008d0a10;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_1d0 + 8));
      LogicalType::LogicalType(&local_178,other);
      Value::Value((Value *)&remap_fun,&local_178);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)local_1d8,(Value *)&remap_fun);
      local_1d0._0_8_ = local_1d8;
      local_1d8 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_1d0);
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_1d0._0_8_ != (Expression *)0x0) {
        (**(code **)(*(_func_int **)local_1d0._0_8_ + 8))();
      }
      local_1d0._0_8_ =
           (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_1d8 + 8))();
      }
      local_1d8 = (undefined1  [8])0x0;
      Value::~Value((Value *)&remap_fun);
      LogicalType::~LogicalType(&local_178);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)local_1d0,&mapping->column_map);
      remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)local_1d0._0_8_;
      local_1d0._0_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &remap_fun);
      if (remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
          (_func_int **)0x0) {
        (**(code **)(*remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      if ((Expression *)local_1d0._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_1d0._0_8_ + 8))();
      }
      if ((mapping->default_value).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
        LogicalType::LogicalType(&local_190,SQLNULL);
        Value::Value((Value *)&remap_fun,&local_190);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)local_1d8,(Value *)&remap_fun);
        local_1d0._0_8_ = local_1d8;
        local_1d8 = (undefined1  [8])0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&children,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_1d0);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_1d0._0_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_1d0._0_8_ + 8))();
        }
        local_1d0._0_8_ = (Expression *)0x0;
        if (local_1d8 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_1d8 + 8))();
        }
        local_1d8 = (undefined1  [8])0x0;
        Value::~Value((Value *)&remap_fun);
        LogicalType::~LogicalType(&local_190);
      }
      else {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&children,&mapping->default_value);
      }
      RemapStructFun::GetFunction();
      (*remap_fun.bind)((ClientContext *)local_1d0,(ScalarFunction *)local_1d0._24_8_,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&remap_fun);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&children,0);
      local_1d0._16_8_ =
           (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      target_type = vector<duckdb::LogicalType,_true>::get<true>
                              (&remap_fun.super_BaseScalarFunction.super_SimpleFunction.arguments,0)
      ;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_1d8,(ClientContext *)local_1d0._24_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_1d0 + 0x10),target_type,false);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&children,0);
      auVar2 = local_1d8;
      local_1d8 = (undefined1  [8])0x0;
      _Var1._M_head_impl =
           (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar2;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_1d8 + 8))();
      }
      local_1d8 = (undefined1  [8])0x0;
      if ((element_type *)local_1d0._16_8_ != (element_type *)0x0) {
        (*((BaseExpression *)local_1d0._16_8_)->_vptr_BaseExpression[1])();
      }
      local_1d0._16_8_ = (element_type *)0x0;
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType_const&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
                ((duckdb *)local_1d8,other,&remap_fun,&children,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)local_1d0);
      *(undefined1 (*) [8])this = local_1d8;
      if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_1d0._0_8_ !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*((BaseExpression *)local_1d0._0_8_)->_vptr_BaseExpression[1])();
      }
      ScalarFunction::~ScalarFunction(&remap_fun);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&children);
    }
    else {
      if (is_trivially_mappable) goto LAB_008d0a10;
      *(Expression **)this =
           (mapping->default_value).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (mapping->default_value).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    }
    if ((_func_int **)local_1d0._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_1d0._8_8_ + 8))();
    }
  }
  else {
LAB_008d0a10:
    bVar5 = LogicalType::operator!=(&pMVar6->type,other);
    if (bVar5) {
      local_1d0._32_8_ = local_1d0._8_8_;
      local_1d0._8_8_ = (long *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&remap_fun,(ClientContext *)local_1d0._24_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_1d0 + 0x20),other,false);
      pp_Var4 = remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function;
      uVar3 = local_1d0._8_8_;
      remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      local_1d0._8_8_ = pp_Var4;
      if (((long *)uVar3 != (long *)0x0) &&
         ((**(code **)(*(long *)uVar3 + 8))(),
         remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
         (_func_int **)0x0)) {
        (**(code **)(*remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      remap_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      if ((_func_int **)local_1d0._32_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_1d0._32_8_ + 8))();
      }
    }
    *(undefined8 *)this = local_1d0._8_8_;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConstructMapExpression(ClientContext &context, idx_t local_idx, ColumnMapResult &mapping,
                                              const MultiFileColumnDefinition &global_column,
                                              bool is_trivially_mappable) {
	auto &local_column = *mapping.local_column;
	unique_ptr<Expression> expr;
	expr = make_uniq<BoundReferenceExpression>(local_column.type, local_idx);
	if (global_column.type.id() != LogicalTypeId::STRUCT ||
	    (!mapping.column_map.IsNull() && mapping.column_map.type().id() != LogicalTypeId::STRUCT) ||
	    is_trivially_mappable) {
		// not a struct - potentially add a cast
		if (local_column.type != global_column.type) {
			expr = BoundCastExpression::AddCastToType(context, std::move(expr), global_column.type);
		}
		return expr;
	}
	// struct column - generate a remap_struct - but only if we have any columns to remap
	if (mapping.column_map.IsNull()) {
		// no columns to map - emit the default value directly
		return std::move(mapping.default_value);
	}
	// generate the remap_struct function call
	vector<unique_ptr<Expression>> children;
	children.push_back(std::move(expr));
	children.push_back(make_uniq<BoundConstantExpression>(Value(global_column.type)));
	children.push_back(make_uniq<BoundConstantExpression>(std::move(mapping.column_map)));
	if (!mapping.default_value) {
		children.push_back(make_uniq<BoundConstantExpression>(Value()));
	} else {
		children.push_back(std::move(mapping.default_value));
	}
	auto remap_fun = RemapStructFun::GetFunction();
	auto bind_data = remap_fun.bind(context, remap_fun, children);
	children[0] = BoundCastExpression::AddCastToType(context, std::move(children[0]), remap_fun.arguments[0]);
	return make_uniq<BoundFunctionExpression>(global_column.type, std::move(remap_fun), std::move(children),
	                                          std::move(bind_data));
}